

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_mristep.c
# Opt level: O1

int MRIStepInnerStepper_AddForcing(MRIStepInnerStepper stepper,sunrealtype t,N_Vector f)

{
  double dVar1;
  double dVar2;
  long lVar3;
  int iVar4;
  double dVar5;
  
  if (stepper == (MRIStepInnerStepper)0x0) {
    iVar4 = -0x16;
    arkProcessError((ARKodeMem)0x0,-0x16,0x1175,"MRIStepInnerStepper_AddForcing",
                    "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/arkode/arkode_mristep.c"
                    ,"Inner stepper memory is NULL");
  }
  else {
    *stepper->vals = 1.0;
    *stepper->vecs = f;
    iVar4 = stepper->nforcing;
    if (0 < (long)iVar4) {
      dVar1 = stepper->tshift;
      dVar2 = stepper->tscale;
      dVar5 = 1.0;
      lVar3 = 0;
      do {
        stepper->vals[lVar3 + 1] = dVar5;
        stepper->vecs[lVar3 + 1] = stepper->forcing[lVar3];
        lVar3 = lVar3 + 1;
        dVar5 = dVar5 * ((t - dVar1) / dVar2);
      } while (iVar4 != lVar3);
    }
    N_VLinearCombination(iVar4 + 1,stepper->vals,stepper->vecs,f);
    iVar4 = 0;
  }
  return iVar4;
}

Assistant:

int MRIStepInnerStepper_AddForcing(MRIStepInnerStepper stepper, sunrealtype t,
                                   N_Vector f)
{
  sunrealtype tau, taui;
  int i;

  if (stepper == NULL)
  {
    arkProcessError(NULL, ARK_ILL_INPUT, __LINE__, __func__, __FILE__,
                    "Inner stepper memory is NULL");
    return ARK_ILL_INPUT;
  }

  /* always append the constant forcing term */
  stepper->vals[0] = ONE;
  stepper->vecs[0] = f;

  /* compute normalized time tau and initialize tau^i */
  tau  = (t - stepper->tshift) / (stepper->tscale);
  taui = ONE;

  for (i = 0; i < stepper->nforcing; i++)
  {
    stepper->vals[i + 1] = taui;
    stepper->vecs[i + 1] = stepper->forcing[i];
    taui *= tau;
  }

  N_VLinearCombination(stepper->nforcing + 1, stepper->vals, stepper->vecs, f);

  return ARK_SUCCESS;
}